

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.h
# Opt level: O1

void __thiscall CEExceptionHandler::CEExceptionHandler(CEExceptionHandler *this)

{
  string *this_00;
  char *pcVar1;
  string *this_01;
  uint uVar2;
  ulong uVar3;
  void *array [100];
  new_allocator<char> local_3d1;
  string *local_3d0;
  string *local_3c8;
  string *local_3c0;
  string *local_3b8;
  string *local_3b0;
  CEExceptionHandler *local_3a8;
  long local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [808];
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__CEExceptionHandler_001449b8;
  local_3b0 = &this->origin_;
  std::__cxx11::string::string((string *)local_3b0);
  local_3b8 = &this->type_;
  std::__cxx11::string::string((string *)local_3b8);
  local_3c0 = &this->message_;
  std::__cxx11::string::string((string *)local_3c0);
  this_00 = &this->backtrace_;
  std::__cxx11::string::string((string *)this_00);
  local_3c8 = &this->full_msg_;
  local_3a8 = this;
  std::__cxx11::string::string((string *)local_3c8);
  local_3d0 = (string *)this_00;
  uVar2 = backtrace(local_358,100);
  local_3a0 = backtrace_symbols(local_358,uVar2);
  std::__cxx11::string::operator+=
            ((string *)this_00,"Exception encountered. Printing backtrace...\n");
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      pcVar1 = *(char **)(local_3a0 + uVar3 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_398,pcVar1,(allocator *)&local_3d1);
      this_01 = local_3d0;
      std::operator+(&local_378,&local_398,"\n");
      std::__cxx11::string::operator+=(this_01,(string *)&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_398);
      __gnu_cxx::new_allocator<char>::~new_allocator(&local_3d1);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

CEExceptionHandler() {
        // get void*'s for all entries on the stack
        void *array[100];
        int size = backtrace(array, 100);

        // print out all the frames to stderr
        char** bcktrace = backtrace_symbols(array, size);

        backtrace_ += "Exception encountered. Printing backtrace...\n";
        for (int i = 0; i < size; i++) {
            backtrace_ += std::string(bcktrace[i]) + "\n";
        }
    }